

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

idx_t __thiscall
duckdb::ColumnReader::ReadInternal
          (ColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result)

{
  data_ptr_t in_RCX;
  idx_t in_RDX;
  ColumnReader *in_RSI;
  idx_t in_RDI;
  data_ptr_t in_R8;
  idx_t read_now;
  uint64_t to_read;
  idx_t result_offset;
  optional_ptr<duckdb::TableFilterState,_true> in_stack_ffffffffffffffb0;
  optional_ptr<const_duckdb::TableFilter,_true> in_stack_ffffffffffffffb8;
  optional_ptr<const_duckdb::TableFilter,_true> in_stack_ffffffffffffffc0;
  Vector *result_00;
  ColumnReader *this_00;
  
  result_00 = (Vector *)0x0;
  this_00 = in_RSI;
  for (; in_RSI != (ColumnReader *)0x0;
      in_RSI = (ColumnReader *)((long)in_RSI - (long)in_stack_ffffffffffffffc0.ptr)) {
    optional_ptr<const_duckdb::TableFilter,_true>::optional_ptr
              ((optional_ptr<const_duckdb::TableFilter,_true> *)&stack0xffffffffffffffb8,
               (TableFilter *)0x0);
    optional_ptr<duckdb::TableFilterState,_true>::optional_ptr
              ((optional_ptr<duckdb::TableFilterState,_true> *)&stack0xffffffffffffffb0,
               (TableFilterState *)0x0);
    in_stack_ffffffffffffffc0.ptr =
         (TableFilter *)
         ReadPageHeaders((ColumnReader *)in_stack_ffffffffffffffb0.ptr,in_RDI,
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8.ptr);
    ReadData(this_00,in_RDX,in_RCX,in_R8,result_00,(idx_t)in_RSI);
    result_00 = result_00 +
                (long)&((ColumnReader *)in_stack_ffffffffffffffc0.ptr)->_vptr_ColumnReader;
  }
  FinishRead((ColumnReader *)in_stack_ffffffffffffffc0.ptr,(idx_t)in_stack_ffffffffffffffb8.ptr);
  return (idx_t)this_00;
}

Assistant:

idx_t ColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	idx_t result_offset = 0;
	auto to_read = num_values;
	D_ASSERT(to_read <= STANDARD_VECTOR_SIZE);

	while (to_read > 0) {
		auto read_now = ReadPageHeaders(to_read);

		ReadData(read_now, define_out, repeat_out, result, result_offset);

		result_offset += read_now;
		to_read -= read_now;
	}
	FinishRead(num_values);

	return num_values;
}